

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapic.cc
# Opt level: O1

void __thiscall rapic::client::disconnect(client *this)

{
  if (this->socket_ != -1) {
    close(this->socket_);
  }
  this->socket_ = -1;
  this->state_ = disconnected;
  this->last_keepalive_ = 0;
  (this->wbuffer_)._M_string_length = 0;
  *(this->wbuffer_)._M_dataplus._M_p = '\0';
  return;
}

Assistant:

auto client::disconnect() -> void
{
  if (socket_ != -1)
    close(socket_);
  socket_ = -1;
  state_ = rapic::connection_state::disconnected;
  last_keepalive_ = 0;
  wbuffer_.clear();
}